

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O3

int32_t __thiscall
icu_63::LaoBreakEngine::divideUpDictionaryRange
          (LaoBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  bool bVar1;
  LaoBreakEngine *pLVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  UChar32 c;
  int iVar7;
  UChar32 UVar8;
  long lVar9;
  int64_t iVar10;
  int64_t iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  UnicodeSet *this_00;
  int32_t iVar16;
  ulong uVar17;
  UErrorCode status;
  PossibleWord words [3];
  UErrorCode local_2ac;
  UVector32 *local_2a8;
  int64_t local_2a0;
  LaoBreakEngine *local_298;
  ulong local_290;
  UnicodeSet *local_288;
  long local_280;
  PossibleWord *local_278;
  ulong local_270;
  UnicodeSet *local_268 [2];
  PossibleWord aPStack_258 [3];
  
  iVar16 = 0;
  if (3 < rangeEnd - rangeStart) {
    local_2ac = U_ZERO_ERROR;
    lVar9 = 0x10;
    do {
      *(undefined8 *)((long)local_268 + lVar9) = 0;
      *(undefined8 *)((long)aPStack_258[0].cuLengths + lVar9 + -0x1c) = 0xffffffff;
      *(undefined4 *)((long)aPStack_258[0].cuLengths + lVar9 + -0x14) = 0;
      lVar9 = lVar9 + 0xb4;
    } while (lVar9 != 0x22c);
    local_2a8 = foundBreaks;
    utext_setNativeIndex_63(text,(long)rangeStart);
    uVar17 = 0;
    if (local_2ac < U_ILLEGAL_ARGUMENT_ERROR) {
      local_280 = (long)rangeEnd;
      local_268[1] = &this->fEndWordSet;
      local_268[0] = &this->fBeginWordSet;
      local_288 = &this->fMarkSet;
      uVar17 = 0;
      local_298 = this;
      do {
        pLVar2 = local_298;
        local_2a0 = utext_getNativeIndex_63(text);
        if (rangeEnd <= (int)local_2a0) break;
        iVar14 = (int)uVar17;
        uVar12 = iVar14 + (int)(uVar17 / 3) * -3;
        iVar16 = PossibleWord::candidates(aPStack_258 + uVar12,text,pLVar2->fDictionary,rangeEnd);
        if (iVar16 == 1) {
LAB_00302edb:
          utext_setNativeIndex_63
                    (text,(long)aPStack_258[uVar12].cuLengths[aPStack_258[uVar12].mark] +
                          (long)aPStack_258[uVar12].offset);
          iVar16 = aPStack_258[uVar12].cuLengths[aPStack_258[uVar12].mark];
          uVar17 = (ulong)(iVar14 + 1);
          bVar1 = aPStack_258[uVar12].cpLengths[aPStack_258[uVar12].mark] < 3;
        }
        else {
          if (1 < iVar16) {
            iVar10 = utext_getNativeIndex_63(text);
            if (iVar10 < local_280) {
              uVar4 = ((iVar14 + 1U) / 3) * -3 + iVar14 + 1;
              do {
                iVar16 = PossibleWord::candidates
                                   (aPStack_258 + uVar4,text,pLVar2->fDictionary,rangeEnd);
                if (0 < iVar16) {
                  aPStack_258[uVar12].mark = aPStack_258[uVar12].current;
                  iVar10 = utext_getNativeIndex_63(text);
                  if (rangeEnd <= (int)iVar10) break;
                  while( true ) {
                    iVar16 = PossibleWord::candidates
                                       (aPStack_258 + (((iVar14 + 2U) / 3) * -3 + iVar14 + 2),text,
                                        pLVar2->fDictionary,rangeEnd);
                    if (iVar16 != 0) {
                      aPStack_258[uVar12].mark = aPStack_258[uVar12].current;
                      goto LAB_00302edb;
                    }
                    if (aPStack_258[uVar4].current < 1) break;
                    iVar13 = aPStack_258[uVar4].offset;
                    uVar5 = aPStack_258[uVar4].current - 1;
                    aPStack_258[uVar4].current = uVar5;
                    utext_setNativeIndex_63
                              (text,(long)aPStack_258[uVar4].cuLengths[uVar5] + (long)iVar13);
                  }
                }
                if (aPStack_258[uVar12].current < 1) break;
                iVar13 = aPStack_258[uVar12].offset;
                uVar5 = aPStack_258[uVar12].current - 1;
                aPStack_258[uVar12].current = uVar5;
                utext_setNativeIndex_63
                          (text,(long)aPStack_258[uVar12].cuLengths[uVar5] + (long)iVar13);
              } while( true );
            }
            goto LAB_00302edb;
          }
          bVar1 = true;
          iVar16 = 0;
        }
        iVar10 = utext_getNativeIndex_63(text);
        this_00 = local_288;
        if ((bVar1) && ((int)iVar10 < rangeEnd)) {
          uVar12 = (int)uVar17 + (int)(uVar17 / 3) * -3;
          iVar6 = PossibleWord::candidates
                            (aPStack_258 + uVar12,text,local_298->fDictionary,rangeEnd);
          if ((iVar6 < 1) && ((iVar16 == 0 || (aPStack_258[uVar12].prefix < 3)))) {
            uVar12 = (int)local_2a0 + iVar16;
            local_290 = uVar17;
            iVar10 = utext_getNativeIndex_63(text);
            UVar8 = utext_next32_63(text);
            iVar11 = utext_getNativeIndex_63(text);
            iVar13 = (int)iVar11 - (int)iVar10;
            iVar14 = rangeEnd - (iVar13 + uVar12);
            local_270 = (ulong)uVar12;
            if (0 < iVar14) {
              local_278 = aPStack_258 + ((int)local_290 + 1U) % 3;
              do {
                c = utext_current32_63(text);
                UVar3 = UnicodeSet::contains(local_268[1],UVar8);
                if ((UVar3 != '\0') && (UVar3 = UnicodeSet::contains(local_268[0],c), UVar3 != '\0')
                   ) {
                  iVar6 = PossibleWord::candidates(local_278,text,local_298->fDictionary,rangeEnd);
                  utext_setNativeIndex_63(text,(long)((int)local_270 + iVar13));
                  if (0 < iVar6) break;
                }
                iVar10 = utext_getNativeIndex_63(text);
                UVar8 = utext_next32_63(text);
                iVar11 = utext_getNativeIndex_63(text);
                iVar7 = (int)iVar11 - (int)iVar10;
                iVar13 = iVar13 + iVar7;
                iVar15 = iVar14 - iVar7;
                bVar1 = iVar7 <= iVar14;
                iVar14 = iVar15;
              } while (iVar15 != 0 && bVar1);
            }
            uVar17 = (ulong)((int)local_290 + (uint)(iVar16 < 1));
            iVar16 = iVar13 + iVar16;
            this_00 = local_288;
          }
          else {
            utext_setNativeIndex_63(text,(long)((int)local_2a0 + iVar16));
          }
        }
        while( true ) {
          iVar10 = utext_getNativeIndex_63(text);
          if (rangeEnd <= (int)iVar10) break;
          UVar8 = utext_current32_63(text);
          UVar3 = UnicodeSet::contains(this_00,UVar8);
          if (UVar3 == '\0') break;
          utext_next32_63(text);
          iVar11 = utext_getNativeIndex_63(text);
          iVar16 = (iVar16 - (int)iVar10) + (int)iVar11;
        }
        if (0 < iVar16) {
          iVar14 = local_2a8->count;
          if ((iVar14 < -1) || (local_2a8->capacity <= iVar14)) {
            UVar3 = UVector32::expandCapacity(local_2a8,iVar14 + 1,&local_2ac);
            if (UVar3 == '\0') goto LAB_00303246;
            iVar14 = local_2a8->count;
          }
          local_2a8->elements[iVar14] = iVar16 + (int)local_2a0;
          local_2a8->count = local_2a8->count + 1;
        }
LAB_00303246:
      } while (local_2ac < U_ILLEGAL_ARGUMENT_ERROR);
    }
    iVar13 = (int)uVar17;
    iVar14 = local_2a8->count;
    if ((long)iVar14 < 1) {
      if (0 < rangeEnd) {
        return iVar13;
      }
    }
    else {
      if (local_2a8->elements[(long)iVar14 + -1] < rangeEnd) {
        return iVar13;
      }
      local_2a8->count = iVar14 + -1;
    }
    iVar16 = iVar13 + -1;
  }
  return iVar16;
}

Assistant:

int32_t
LaoBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    if ((rangeEnd - rangeStart) < LAO_MIN_WORD_SPAN) {
        return 0;       // Not enough characters for two words
    }

    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;
    int32_t cuWordLength = 0;
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[LAO_LOOKAHEAD];
    
    utext_setNativeIndex(text, rangeStart);
    
    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cuWordLength = 0;
        cpWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%LAO_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
        
        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % LAO_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % LAO_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if (utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % LAO_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound%LAO_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }
                    
                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }
                    
                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % LAO_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % LAO_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % LAO_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % LAO_LOOKAHEAD].backUp(text));
foundBest:
            cuWordLength = words[wordsFound % LAO_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % LAO_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        
        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it withe the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cpWordLength < LAO_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % LAO_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound%LAO_LOOKAHEAD].longestPrefix() < LAO_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current + cuWordLength);
                UChar32 pc;
                UChar32 uc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        // TODO: this looks iffy; compare with old code.
                        int32_t num_candidates = words[(wordsFound + 1) % LAO_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current + cuWordLength + chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }
                
                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }
                
                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current + cuWordLength);
            }
        }
        
        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }
        
        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
        // NOT CURRENTLY APPLICABLE TO LAO

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }

    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}